

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sz_decompress_3d.cpp
# Opt level: O0

void prediction_and_decompression_2d_with_border_prediction<float>
               (DSize_2d *size,meanInfo<float> *mean_info,double precision,int intv_radius,
               float *reg_params,uchar *indicator,int *type,float *unpredictable_data_pos,
               float *dec_data)

{
  size_t dim0_offset;
  void *__s;
  void *pvVar1;
  int **in_RCX;
  ulong *in_RDI;
  float **in_R8;
  float *in_R9;
  meanInfo<float> *in_stack_00000010;
  int size_y;
  int size_x;
  size_t j;
  float *pred_buffer_pos;
  float *y_data_pos;
  size_t i;
  float *x_data_pos;
  float *pred_buffer;
  size_t buffer_dim0_offset;
  float *reg_params_pos;
  uchar *indicator_pos;
  int *type_pos;
  int local_a8;
  int local_a0;
  ulong uVar2;
  int size_y_00;
  int intv_radius_00;
  meanInfo<float> *precision_00;
  float *buffer;
  meanInfo<float> *mean_info_00;
  
  dim0_offset = in_RDI[1] + 1;
  __s = malloc((long)((int)in_RDI[3] + 1) * (in_RDI[1] + 1) * 4);
  memset(__s,0,(long)((int)in_RDI[3] + 1) * (in_RDI[1] + 1) * 4);
  precision_00 = in_stack_00000010;
  for (buffer = (float *)0x0; buffer < (float *)in_RDI[4]; buffer = (float *)((long)buffer + 1)) {
    pvVar1 = __s;
    mean_info_00 = precision_00;
    for (uVar2 = 0; uVar2 < in_RDI[5]; uVar2 = uVar2 + 1) {
      if ((ulong)(((long)buffer + 1) * (long)(int)in_RDI[3]) < *in_RDI) {
        local_a0 = (int)in_RDI[3];
      }
      else {
        local_a0 = (int)*in_RDI - (int)buffer * (int)in_RDI[3];
      }
      if ((uVar2 + 1) * (long)(int)in_RDI[3] < in_RDI[1]) {
        local_a8 = (int)in_RDI[3];
      }
      else {
        local_a8 = (int)in_RDI[1] - (int)uVar2 * (int)in_RDI[3];
      }
      size_y_00 = (int)(uVar2 >> 0x20);
      intv_radius_00 = (int)((ulong)pvVar1 >> 0x20);
      if (*(char *)in_R8 == '\0') {
        block_pred_and_decompress_lorenzo_2d<float>
                  (mean_info_00,buffer,(double)precision_00,intv_radius_00,(int)pvVar1,size_y_00,
                   CONCAT44(local_a0,local_a8),dim0_offset,in_RCX,in_R8,in_R9);
      }
      else {
        block_pred_and_decompress_regression_2d_with_buffer<float>
                  ((float *)mean_info_00,buffer,(double)precision_00,intv_radius_00,(int)pvVar1,
                   size_y_00,CONCAT44(local_a0,local_a8),dim0_offset,in_RCX,in_R8,in_R9);
        in_RCX = (int **)((long)in_RCX + 0xc);
      }
      precision_00 = (meanInfo<float> *)(&precision_00->use_mean + (long)local_a8 * 4);
      pvVar1 = (void *)((long)pvVar1 + (long)local_a8 * 4);
      in_R8 = (float **)((long)in_R8 + 1);
    }
    memcpy(__s,(void *)((long)__s + (long)(int)in_RDI[3] * dim0_offset * 4),dim0_offset << 2);
    precision_00 = (meanInfo<float> *)
                   (&mean_info_00->use_mean + (long)(int)in_RDI[3] * in_RDI[7] * 4);
  }
  free(__s);
  return;
}

Assistant:

void
prediction_and_decompression_2d_with_border_prediction(const DSize_2d& size, const meanInfo<T>& mean_info, double precision,
	int intv_radius, const float * reg_params, const unsigned char * indicator, 
	const int * type, const T * unpredictable_data_pos, T * dec_data){
	const int * type_pos = type;
	const unsigned char * indicator_pos = indicator;
	const float * reg_params_pos = reg_params;
	size_t buffer_dim0_offset = size.d2 + 1;
	T * pred_buffer = (T *) malloc((size.block_size+1)*(size.d2+1)*sizeof(T));
	memset(pred_buffer, 0, (size.block_size+1)*(size.d2+1)*sizeof(T));
	T * x_data_pos = dec_data;
	for(size_t i=0; i<size.num_x; i++){
		T * y_data_pos = x_data_pos;
		T * pred_buffer_pos = pred_buffer;
		for(size_t j=0; j<size.num_y; j++){
			int size_x = ((i+1)*size.block_size < size.d1) ? size.block_size : size.d1 - i*size.block_size;
			int size_y = ((j+1)*size.block_size < size.d2) ? size.block_size : size.d2 - j*size.block_size;
			if(*indicator_pos){
				// regression
				block_pred_and_decompress_regression_2d_with_buffer(reg_params_pos, pred_buffer_pos, precision, intv_radius, 
					size_x, size_y, buffer_dim0_offset, size.dim0_offset, type_pos, unpredictable_data_pos, y_data_pos);
				reg_params_pos += RegCoeffNum2d;
			}
			else{
				// Lorenzo
				block_pred_and_decompress_lorenzo_2d(mean_info, pred_buffer_pos, precision, intv_radius, size_x, size_y, 
						buffer_dim0_offset, size.dim0_offset, type_pos, unpredictable_data_pos, y_data_pos);
			}
			y_data_pos += size_y;
			pred_buffer_pos += size_y;
			indicator_pos ++;
		}
		memcpy(pred_buffer, pred_buffer + size.block_size*buffer_dim0_offset, buffer_dim0_offset*sizeof(T));
		x_data_pos += size.block_size*size.dim0_offset;
	}
	free(pred_buffer);
}